

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<short>::erase(vector<short> *this,short *pFirst,short *pEnd)

{
  bool bVar1;
  vector<short> *pvVar2;
  short *psVar3;
  long lVar4;
  vector<short> *in_RDX;
  vector<short> *in_RSI;
  vector<short> *in_RDI;
  int64_t n;
  int64_t ofs;
  vector<short> *in_stack_ffffffffffffffb8;
  vector<short> *this_00;
  
  if (in_RDX < in_RSI) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<short>::erase(T *, T *) [T = short]");
  }
  this_00 = in_RSI;
  pvVar2 = (vector<short> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= this_00) {
    in_stack_ffffffffffffffb8 = in_RSI;
    pvVar2 = (vector<short> *)end(in_RDI);
    bVar1 = in_stack_ffffffffffffffb8 <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pFirst >= begin() && pFirst <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x319,"void basisu::vector<short>::erase(T *, T *) [T = short]");
  }
  pvVar2 = (vector<short> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= in_RDX) {
    pvVar2 = (vector<short> *)end(in_RDI);
    bVar1 = in_RDX <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pEnd >= begin() && pEnd <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x31a,"void basisu::vector<short>::erase(T *, T *) [T = short]");
  }
  psVar3 = begin(in_RDI);
  lVar4 = (long)in_RSI - (long)psVar3 >> 1;
  if ((lVar4 < 0) || (0xffffffff < lVar4)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,799,"void basisu::vector<short>::erase(T *, T *) [T = short]");
  }
  lVar4 = (long)in_RDX - (long)in_RSI >> 1;
  if ((-1 < lVar4) && (lVar4 < 0x100000000)) {
    erase(this_00,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
          (uint32_t)in_stack_ffffffffffffffb8);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x326,"void basisu::vector<short>::erase(T *, T *) [T = short]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }